

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_sse2.cpp
# Opt level: O0

void memfill32(uint32_t *dest,uint32_t value,int length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int local_208;
  uint32_t *local_200;
  __m128i vector_data;
  int length_local;
  uint32_t value_local;
  uint32_t *dest_local;
  
  uVar1 = CONCAT44(value,value);
  uVar2 = CONCAT44(value,value);
  local_200 = dest;
  for (local_208 = length; local_208 != 0 && ((ulong)local_200 & 0xf) != 0;
      local_208 = local_208 + -1) {
    *local_200 = value;
    local_200 = local_200 + 1;
  }
  for (; 0x1f < local_208; local_208 = local_208 + -0x20) {
    *(undefined8 *)local_200 = uVar1;
    *(undefined8 *)(local_200 + 2) = uVar2;
    *(undefined8 *)(local_200 + 4) = uVar1;
    *(undefined8 *)(local_200 + 6) = uVar2;
    *(undefined8 *)(local_200 + 8) = uVar1;
    *(undefined8 *)(local_200 + 10) = uVar2;
    *(undefined8 *)(local_200 + 0xc) = uVar1;
    *(undefined8 *)(local_200 + 0xe) = uVar2;
    *(undefined8 *)(local_200 + 0x10) = uVar1;
    *(undefined8 *)(local_200 + 0x12) = uVar2;
    *(undefined8 *)(local_200 + 0x14) = uVar1;
    *(undefined8 *)(local_200 + 0x16) = uVar2;
    *(undefined8 *)(local_200 + 0x18) = uVar1;
    *(undefined8 *)(local_200 + 0x1a) = uVar2;
    *(undefined8 *)(local_200 + 0x1c) = uVar1;
    *(undefined8 *)(local_200 + 0x1e) = uVar2;
    local_200 = local_200 + 0x20;
  }
  if (0xf < local_208) {
    *(undefined8 *)local_200 = uVar1;
    *(undefined8 *)(local_200 + 2) = uVar2;
    *(undefined8 *)(local_200 + 4) = uVar1;
    *(undefined8 *)(local_200 + 6) = uVar2;
    *(undefined8 *)(local_200 + 8) = uVar1;
    *(undefined8 *)(local_200 + 10) = uVar2;
    *(undefined8 *)(local_200 + 0xc) = uVar1;
    *(undefined8 *)(local_200 + 0xe) = uVar2;
    local_200 = local_200 + 0x10;
    local_208 = local_208 + -0x10;
  }
  if (7 < local_208) {
    *(undefined8 *)local_200 = uVar1;
    *(undefined8 *)(local_200 + 2) = uVar2;
    *(undefined8 *)(local_200 + 4) = uVar1;
    *(undefined8 *)(local_200 + 6) = uVar2;
    local_200 = local_200 + 8;
    local_208 = local_208 + -8;
  }
  if (3 < local_208) {
    *(undefined8 *)local_200 = uVar1;
    *(undefined8 *)(local_200 + 2) = uVar2;
    local_200 = local_200 + 4;
    local_208 = local_208 + -4;
  }
  for (; local_208 != 0; local_208 = local_208 + -1) {
    *local_200 = value;
    local_200 = local_200 + 1;
  }
  return;
}

Assistant:

void memfill32(uint32_t* dest, uint32_t value, int length)
{
    __m128i vector_data = _mm_set_epi32(value, value, value, value);

    // run till memory alligned to 16byte memory
    while (length && ((uintptr_t)dest & 0xf)) {
        *dest++ = value;
        length--;
    }

    while (length >= 32) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);
        _mm_store_si128((__m128i*)(dest + 16), vector_data);
        _mm_store_si128((__m128i*)(dest + 20), vector_data);
        _mm_store_si128((__m128i*)(dest + 24), vector_data);
        _mm_store_si128((__m128i*)(dest + 28), vector_data);

        dest += 32;
        length -= 32;
    }

    if (length >= 16) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);

        dest += 16;
        length -= 16;
    }

    if (length >= 8) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);

        dest += 8;
        length -= 8;
    }

    if (length >= 4) {
        _mm_store_si128((__m128i*)(dest), vector_data);

        dest += 4;
        length -= 4;
    }

    while (length) {
        *dest++ = value;
        length--;
    }
}